

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationiterator.cpp
# Opt level: O1

UChar32 __thiscall
icu_63::CollationIterator::nextSkippedCodePoint(CollationIterator *this,UErrorCode *errorCode)

{
  short sVar1;
  SkippedState *pSVar2;
  uint uVar3;
  int iVar4;
  
  pSVar2 = this->skipped;
  if (pSVar2 != (SkippedState *)0x0) {
    sVar1 = (pSVar2->oldBuffer).fUnion.fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar4 = (pSVar2->oldBuffer).fUnion.fFields.fLength;
    }
    else {
      iVar4 = (int)sVar1 >> 5;
    }
    if (pSVar2->pos < iVar4) {
      uVar3 = UnicodeString::char32At(&pSVar2->oldBuffer,pSVar2->pos);
      pSVar2->pos = (pSVar2->pos - (uint)(uVar3 < 0x10000)) + 2;
      return uVar3;
    }
  }
  if (this->numCpFwd == 0) {
    iVar4 = -1;
  }
  else {
    iVar4 = (*(this->super_UObject)._vptr_UObject[6])(this);
    pSVar2 = this->skipped;
    if (((pSVar2 != (SkippedState *)0x0) && (-1 < iVar4)) &&
       (0x1f < (ushort)(pSVar2->oldBuffer).fUnion.fStackFields.fLengthAndFlags)) {
      pSVar2->pos = pSVar2->pos + 1;
    }
    if (-1 < iVar4 && 0 < this->numCpFwd) {
      this->numCpFwd = this->numCpFwd + -1;
    }
  }
  return iVar4;
}

Assistant:

UChar32
CollationIterator::nextSkippedCodePoint(UErrorCode &errorCode) {
    if(skipped != NULL && skipped->hasNext()) { return skipped->next(); }
    if(numCpFwd == 0) { return U_SENTINEL; }
    UChar32 c = nextCodePoint(errorCode);
    if(skipped != NULL && !skipped->isEmpty() && c >= 0) { skipped->incBeyond(); }
    if(numCpFwd > 0 && c >= 0) { --numCpFwd; }
    return c;
}